

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLDInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint uVar3;
  DecodeStatus DVar4;
  uint uVar5;
  MCInst *Inst_00;
  ulong Address_00;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rd;
  uint Rm;
  uint Rn;
  uint wb;
  DecodeStatus S;
  void *in_stack_ffffffffffffff90;
  uint64_t in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa4;
  MCInst *in_stack_ffffffffffffffa8;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  MCInst *local_10;
  
  local_2c[0] = MCDisassembler_Success;
  local_14 = in_ESI;
  local_10 = in_RDI;
  fieldFromInstruction_4(in_ESI,0xc,4);
  fieldFromInstruction_4(local_14,0x16,1);
  fieldFromInstruction_4(local_14,0x10,4);
  fieldFromInstruction_4(local_14,0x10,4);
  fieldFromInstruction_4(local_14,4,2);
  uVar2 = fieldFromInstruction_4(local_14,0,4);
  uVar3 = MCInst_getOpcode(local_10);
  if (0xb < uVar3 - 0x398) {
    if (uVar3 - 0x3d9 < 9) {
      DVar4 = DecodeDPairSpacedRegisterClass
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                         in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      _Var1 = Check(local_2c,DVar4);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
      goto LAB_002a61f2;
    }
    if (8 < uVar3 - 0x3e2) {
      DVar4 = DecodeDPRRegisterClass
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                         in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      _Var1 = Check(local_2c,DVar4);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
      goto LAB_002a61f2;
    }
  }
  DVar4 = DecodeDPairRegisterClass
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90);
  _Var1 = Check(local_2c,DVar4);
  if (!_Var1) {
    return MCDisassembler_Fail;
  }
LAB_002a61f2:
  uVar3 = MCInst_getOpcode(local_10);
  switch(uVar3) {
  case 0x444:
  case 0x447:
  case 0x448:
  case 1099:
  case 0x44c:
  case 0x44f:
  case 0x4b8:
  case 0x4bb:
  case 0x4bc:
  case 0x4bf:
  case 0x4c0:
  case 0x4c3:
    DVar4 = DecodeDPRRegisterClass
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98
                       ,in_stack_ffffffffffffff90);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
    break;
  case 0x459:
  case 0x45b:
  case 0x45e:
  case 0x460:
  case 0x463:
  case 0x465:
  case 0x4cd:
  case 0x4cf:
  case 0x4d2:
  case 0x4d4:
  case 0x4d7:
  case 0x4d9:
    DVar4 = DecodeDPRRegisterClass
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98
                       ,in_stack_ffffffffffffff90);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  default:
  }
  uVar3 = MCInst_getOpcode(local_10);
  Inst_00 = (MCInst *)(ulong)(uVar3 - 0x444);
  switch(Inst_00) {
  case (MCInst *)0x0:
  case (MCInst *)0x3:
  case (MCInst *)0x4:
  case (MCInst *)0x7:
  case (MCInst *)0x8:
  case (MCInst *)0xb:
  case (MCInst *)0x74:
  case (MCInst *)0x77:
  case (MCInst *)0x78:
  case (MCInst *)0x7b:
  case (MCInst *)0x7c:
  case (MCInst *)0x7f:
    DVar4 = DecodeDPRRegisterClass
                      (Inst_00,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                       in_stack_ffffffffffffff90);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
    break;
  default:
    break;
  case (MCInst *)0x15:
  case (MCInst *)0x17:
  case (MCInst *)0x1a:
  case (MCInst *)0x1c:
  case (MCInst *)0x1f:
  case (MCInst *)0x21:
  case (MCInst *)0x89:
  case (MCInst *)0x8b:
  case (MCInst *)0x8e:
  case (MCInst *)0x90:
  case (MCInst *)0x93:
  case (MCInst *)0x95:
    DVar4 = DecodeDPRRegisterClass
                      (Inst_00,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                       in_stack_ffffffffffffff90);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  uVar3 = MCInst_getOpcode(local_10);
  if ((((uVar3 == 0x4b8) || (uVar3 - 0x4bb < 2)) || (uVar3 - 0x4bf < 2)) || (uVar3 == 0x4c3)) {
    DVar4 = DecodeDPRRegisterClass
                      (Inst_00,uVar3,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else if ((((uVar3 == 0x4cd) || (uVar3 == 0x4cf)) ||
           ((uVar3 == 0x4d2 || ((uVar3 == 0x4d4 || (uVar3 == 0x4d7)))))) || (uVar3 == 0x4d9)) {
    DVar4 = DecodeDPRRegisterClass
                      (Inst_00,uVar3,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  uVar5 = MCInst_getOpcode(local_10);
  Address_00 = (ulong)(uVar5 - 0x370);
  switch(Address_00) {
  case 0:
  case 1:
  case 3:
  case 4:
  case 5:
  case 6:
  case 9:
  case 10:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x15:
  case 0x16:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x21:
  case 0x22:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x29:
  case 0x2a:
  case 0x2c:
  case 0x2d:
  case 0x2f:
  case 0x30:
  case 0x32:
  case 0x33:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x74:
  case 0x76:
  case 0x77:
  case 0x79:
  case 0x7a:
  case 0x7f:
  case 0x80:
  case 0x85:
  case 0x86:
  case 0x8b:
  case 0x8c:
    MCOperand_CreateImm0(local_10,0);
    break;
  default:
    break;
  case 0xd7:
  case 0xdb:
  case 0xdf:
  case 0xeb:
  case 0xf0:
  case 0xf5:
  case 0x14b:
  case 0x14f:
  case 0x153:
  case 0x15f:
  case 0x164:
  case 0x169:
    DVar4 = DecodeGPRRegisterClass(Inst_00,uVar3,Address_00,in_stack_ffffffffffffff90);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  DVar4 = DecodeAddrMode6Operand(Inst_00,uVar3,Address_00,in_stack_ffffffffffffff90);
  _Var1 = Check(local_2c,DVar4);
  if (_Var1) {
    uVar5 = MCInst_getOpcode(local_10);
    switch((void *)(ulong)(uVar5 - 0x370)) {
    default:
      if (uVar2 == 0xd) {
        MCOperand_CreateReg0(local_10,0);
        return local_2c[0];
      }
    case (void *)0x0:
    case (void *)0x3:
    case (void *)0x5:
    case (void *)0x6:
    case (void *)0x9:
    case (void *)0xc:
    case (void *)0xe:
    case (void *)0xf:
    case (void *)0x15:
    case (void *)0x1b:
    case (void *)0x1d:
    case (void *)0x1e:
    case (void *)0x21:
    case (void *)0x24:
    case (void *)0x26:
    case (void *)0x27:
    case (void *)0x29:
    case (void *)0x2a:
    case (void *)0x2c:
    case (void *)0x2d:
    case (void *)0x2f:
    case (void *)0x30:
    case (void *)0x32:
    case (void *)0x33:
      if ((uVar2 != 0xd) && (uVar2 != 0xf)) {
        DVar4 = DecodeGPRRegisterClass(Inst_00,uVar3,Address_00,(void *)(ulong)(uVar5 - 0x370));
        _Var1 = Check(local_2c,DVar4);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
      }
      break;
    case (void *)0x6a:
    case (void *)0x6d:
    case (void *)0x70:
    case (void *)0x73:
    case (void *)0x76:
    case (void *)0x79:
    case (void *)0x7f:
    case (void *)0x85:
    case (void *)0x8b:
    }
    return local_2c[0];
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeVLDInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned wb, Rn, Rm;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	wb = fieldFromInstruction_4(Insn, 16, 4);
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 4, 2) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);

	// First output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD1q16: case ARM_VLD1q32: case ARM_VLD1q64: case ARM_VLD1q8:
		case ARM_VLD1q16wb_fixed: case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_fixed: case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_fixed: case ARM_VLD1q64wb_register:
		case ARM_VLD1q8wb_fixed: case ARM_VLD1q8wb_register:
		case ARM_VLD2d16: case ARM_VLD2d32: case ARM_VLD2d8:
		case ARM_VLD2d16wb_fixed: case ARM_VLD2d16wb_register:
		case ARM_VLD2d32wb_fixed: case ARM_VLD2d32wb_register:
		case ARM_VLD2d8wb_fixed: case ARM_VLD2d8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2b16:
		case ARM_VLD2b32:
		case ARM_VLD2b8:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b16wb_register:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2b32wb_register:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b8wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	// Second output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD3d8:
		case ARM_VLD3d16:
		case ARM_VLD3d32:
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+1)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD3q8:
		case ARM_VLD3q16:
		case ARM_VLD3q32:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
		default:
			break;
	}

	// Third output register
	switch(MCInst_getOpcode(Inst)) {
		case ARM_VLD3d8:
		case ARM_VLD3d16:
		case ARM_VLD3d32:
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD3q8:
		case ARM_VLD3q16:
		case ARM_VLD3q32:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+4)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Fourth output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+6)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Writeback operand
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD1d8wb_fixed:
		case ARM_VLD1d16wb_fixed:
		case ARM_VLD1d32wb_fixed:
		case ARM_VLD1d64wb_fixed:
		case ARM_VLD1d8wb_register:
		case ARM_VLD1d16wb_register:
		case ARM_VLD1d32wb_register:
		case ARM_VLD1d64wb_register:
		case ARM_VLD1q8wb_fixed:
		case ARM_VLD1q16wb_fixed:
		case ARM_VLD1q32wb_fixed:
		case ARM_VLD1q64wb_fixed:
		case ARM_VLD1q8wb_register:
		case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_register:
		case ARM_VLD1d8Twb_fixed:
		case ARM_VLD1d8Twb_register:
		case ARM_VLD1d16Twb_fixed:
		case ARM_VLD1d16Twb_register:
		case ARM_VLD1d32Twb_fixed:
		case ARM_VLD1d32Twb_register:
		case ARM_VLD1d64Twb_fixed:
		case ARM_VLD1d64Twb_register:
		case ARM_VLD1d8Qwb_fixed:
		case ARM_VLD1d8Qwb_register:
		case ARM_VLD1d16Qwb_fixed:
		case ARM_VLD1d16Qwb_register:
		case ARM_VLD1d32Qwb_fixed:
		case ARM_VLD1d32Qwb_register:
		case ARM_VLD1d64Qwb_fixed:
		case ARM_VLD1d64Qwb_register:
		case ARM_VLD2d8wb_fixed:
		case ARM_VLD2d16wb_fixed:
		case ARM_VLD2d32wb_fixed:
		case ARM_VLD2q8wb_fixed:
		case ARM_VLD2q16wb_fixed:
		case ARM_VLD2q32wb_fixed:
		case ARM_VLD2d8wb_register:
		case ARM_VLD2d16wb_register:
		case ARM_VLD2d32wb_register:
		case ARM_VLD2q8wb_register:
		case ARM_VLD2q16wb_register:
		case ARM_VLD2q32wb_register:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2b8wb_register:
		case ARM_VLD2b16wb_register:
		case ARM_VLD2b32wb_register:
			MCOperand_CreateImm0(Inst, 0);
			break;
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, wb, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// AddrMode6 Base (register+alignment)
	if (!Check(&S, DecodeAddrMode6Operand(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	// AddrMode6 Offset (register)
	switch (MCInst_getOpcode(Inst)) {
		default:
			// The below have been updated to have explicit am6offset split
			// between fixed and register offset. For those instructions not
			// yet updated, we need to add an additional reg0 operand for the
			// fixed variant.
			//
			// The fixed offset encodes as Rm == 0xd, so we check for that.
			if (Rm == 0xd) {
				MCOperand_CreateReg0(Inst, 0);
				break;
			}
			// Fall through to handle the register offset variant.
		case ARM_VLD1d8wb_fixed:
		case ARM_VLD1d16wb_fixed:
		case ARM_VLD1d32wb_fixed:
		case ARM_VLD1d64wb_fixed:
		case ARM_VLD1d8Twb_fixed:
		case ARM_VLD1d16Twb_fixed:
		case ARM_VLD1d32Twb_fixed:
		case ARM_VLD1d64Twb_fixed:
		case ARM_VLD1d8Qwb_fixed:
		case ARM_VLD1d16Qwb_fixed:
		case ARM_VLD1d32Qwb_fixed:
		case ARM_VLD1d64Qwb_fixed:
		case ARM_VLD1d8wb_register:
		case ARM_VLD1d16wb_register:
		case ARM_VLD1d32wb_register:
		case ARM_VLD1d64wb_register:
		case ARM_VLD1q8wb_fixed:
		case ARM_VLD1q16wb_fixed:
		case ARM_VLD1q32wb_fixed:
		case ARM_VLD1q64wb_fixed:
		case ARM_VLD1q8wb_register:
		case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_register:
			// The fixed offset post-increment encodes Rm == 0xd. The no-writeback
			// variant encodes Rm == 0xf. Anything else is a register offset post-
			// increment and we need to add the register operand to the instruction.
			if (Rm != 0xD && Rm != 0xF &&
					!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2d8wb_fixed:
		case ARM_VLD2d16wb_fixed:
		case ARM_VLD2d32wb_fixed:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2q8wb_fixed:
		case ARM_VLD2q16wb_fixed:
		case ARM_VLD2q32wb_fixed:
			break;
	}

	return S;
}